

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O1

void __thiscall crunch::print_stats(crunch *this,convert_stats *stats,bool force_image_stats)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  command_line_params *this_00;
  char *pCSVStatsFile;
  dynamic_string csv_filename;
  dynamic_string local_40;
  
  local_40.m_buf_size = 0;
  local_40.m_len = 0;
  local_40.m_pStr = (char *)0x0;
  this_00 = &this->m_params;
  bVar1 = crnlib::command_line_params::get_value_as_string(this_00,"csvfile",0,&local_40,0);
  pcVar4 = "";
  if (local_40.m_pStr != (char *)0x0) {
    pcVar4 = local_40.m_pStr;
  }
  pCSVStatsFile = (char *)0x0;
  if (bVar1) {
    pCSVStatsFile = pcVar4;
  }
  bVar3 = true;
  if (!force_image_stats) {
    bVar2 = crnlib::command_line_params::get_value_as_bool(this_00,"imagestats",0,false);
    if (!bVar2) {
      bVar3 = crnlib::command_line_params::get_value_as_bool(this_00,"mipstats",0,false);
      bVar3 = bVar1 || bVar3;
    }
  }
  bVar1 = crnlib::command_line_params::get_value_as_bool(this_00,"mipstats",0,false);
  bVar2 = crnlib::command_line_params::get_value_as_bool(this_00,"grayscalesampling",0,false);
  bVar1 = crnlib::texture_conversion::convert_stats::print(stats,bVar3,bVar1,bVar2,pCSVStatsFile);
  if (!bVar1) {
    crnlib::console::warning("Unable to compute/display full output file statistics.");
  }
  if ((local_40.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_40.m_pStr + -8) ^ *(uint *)(local_40.m_pStr + -4)) == 0xffffffff)) {
    crnlib::crnlib_free(local_40.m_pStr + -0x10);
  }
  return;
}

Assistant:

void print_stats(texture_conversion::convert_stats& stats, bool force_image_stats = false)
    {
        dynamic_string csv_filename;
        const char* pCSVStatsFilename = m_params.get_value_as_string("csvfile", 0, csv_filename) ? csv_filename.get_ptr() : nullptr;

        bool image_stats = force_image_stats || m_params.get_value_as_bool("imagestats") || m_params.get_value_as_bool("mipstats") || (pCSVStatsFilename != nullptr);
        bool mip_stats = m_params.get_value_as_bool("mipstats");
        bool grayscale_sampling = m_params.get_value_as_bool("grayscalesampling");
        if (!stats.print(image_stats, mip_stats, grayscale_sampling, pCSVStatsFilename))
        {
            console::warning("Unable to compute/display full output file statistics.");
        }
    }